

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpInst *i)

{
  Value *pVVar1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  Op OVar4;
  _Rb_tree_color _Var5;
  bool reversed;
  OpCode OVar6;
  Reg RVar7;
  Reg RVar8;
  tuple<arm::Inst_*,_std::default_delete<arm::Inst>_> tVar9;
  _Base_ptr p_Var10;
  _Head_base<0UL,_arm::Inst_*,_false> _Var11;
  ConditionCode cond;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  Value *pVVar14;
  Value *v;
  initializer_list<mir::inst::Op> __l;
  set<mir::inst::Op,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_> not_reversible;
  __uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_> local_98;
  anon_class_8_1_a78179b7_conflict11 local_90;
  _Rb_tree<mir::inst::Op,_mir::inst::Op,_std::_Identity<mir::inst::Op>,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>
  local_88;
  Operand2 local_58;
  
  pVVar1 = &i->lhs;
  cVar3 = (i->rhs).field_0x18;
  if ((i->lhs).field_0x18 == '\0') {
    if (cVar3 != '\0') goto LAB_001643f9;
LAB_001644a1:
    reversed = false;
    pVVar14 = &i->rhs;
    v = pVVar1;
  }
  else {
    if (((cVar3 == '\0') || ((i->lhs).shift_amount == '\0')) || ((i->rhs).shift_amount != '\0'))
    goto LAB_001644a1;
LAB_001643f9:
    OVar4 = i->op;
    local_58.super_Displayable._vptr_Displayable = (_func_int **)0x500000003;
    local_58.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>
    .super__Move_assign_alias<arm::RegisterOperand,_int>.
    super__Copy_assign_alias<arm::RegisterOperand,_int>.
    super__Move_ctor_alias<arm::RegisterOperand,_int>.
    super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x1100000010;
    local_58.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>
    .super__Move_assign_alias<arm::RegisterOperand,_int>.
    super__Copy_assign_alias<arm::RegisterOperand,_int>.
    super__Move_ctor_alias<arm::RegisterOperand,_int>.
    super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ = 0xf00000012;
    __l._M_len = 6;
    __l._M_array = (iterator)&local_58;
    std::set<mir::inst::Op,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>::set
              ((set<mir::inst::Op,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_> *)
               &local_88,__l,(less<mir::inst::Op> *)&local_90,(allocator_type *)&local_98);
    pVVar14 = pVVar1;
    if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001644ad:
      std::
      _Rb_tree<mir::inst::Op,_mir::inst::Op,_std::_Identity<mir::inst::Op>,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>
      ::~_Rb_tree(&local_88);
      reversed = true;
      v = &i->rhs;
    }
    else {
      p_Var2 = &local_88._M_impl.super__Rb_tree_header;
      p_Var13 = &p_Var2->_M_header;
      do {
        p_Var12 = p_Var13;
        p_Var10 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
        _Var5 = p_Var10[1]._M_color;
        p_Var13 = p_Var10;
        if ((int)_Var5 < (int)OVar4) {
          p_Var13 = p_Var12;
        }
        local_88._M_impl.super__Rb_tree_header._M_header._M_parent =
             (&p_Var10->_M_left)[(int)_Var5 < (int)OVar4];
      } while ((&p_Var10->_M_left)[(int)_Var5 < (int)OVar4] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var13 == p_Var2) goto LAB_001644ad;
      if ((int)_Var5 < (int)OVar4) {
        p_Var10 = p_Var12;
      }
      _Var5 = p_Var10[1]._M_color;
      std::
      _Rb_tree<mir::inst::Op,_mir::inst::Op,_std::_Identity<mir::inst::Op>,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>
      ::~_Rb_tree(&local_88);
      v = &i->rhs;
      reversed = (int)OVar4 < (int)_Var5;
      if ((int)_Var5 <= (int)OVar4) {
        pVVar14 = v;
        v = pVVar1;
      }
    }
  }
  switch(i->op) {
  case Add:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Add;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Sub:
    if (reversed == false) {
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
      local_88._M_impl._0_8_ = &PTR_display_001eb100;
      RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
      RVar8 = translate_value_to_reg(this,v);
      translate_value_to_operand2(&local_58,this,pVVar14);
      tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
      p_Var2 = &local_88._M_impl.super__Rb_tree_header;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           local_58.super_variant<arm::RegisterOperand,_int>.
           super__Variant_base<arm::RegisterOperand,_int>.
           super__Move_assign_alias<arm::RegisterOperand,_int>.
           super__Copy_assign_alias<arm::RegisterOperand,_int>.
           super__Move_ctor_alias<arm::RegisterOperand,_int>.
           super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
      local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
        ::_S_vtable._M_arr
        [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                     super__Variant_base<arm::RegisterOperand,_int>.
                     super__Move_assign_alias<arm::RegisterOperand,_int>.
                     super__Copy_assign_alias<arm::RegisterOperand,_int>.
                     super__Move_ctor_alias<arm::RegisterOperand,_int>.
                     super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                     super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
                (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
      local_88._M_impl._0_8_ = &PTR_display_001ed820;
      *(OpCode *)
       ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Sub;
      *(ConditionCode *)
       ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
      *(undefined ***)
       tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
      *(Reg *)&(((Inst *)((long)tVar9.
                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
               super_Displayable)._vptr_Displayable = RVar7;
      *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
      local_90.__lhs =
           (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
           ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
      *(__index_type *)
       &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
        super_Displayable)._vptr_Displayable =
           (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr
        [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
        _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
                 (variant<arm::RegisterOperand,_int> *)p_Var2);
      *(undefined ***)
       ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820
      ;
      local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98)
      ;
      _Var11._M_head_impl =
           (Inst *)local_98._M_t.
                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    }
    else {
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
      local_88._M_impl._0_8_ = &PTR_display_001eb100;
      RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
      RVar8 = translate_value_to_reg(this,v);
      translate_value_to_operand2(&local_58,this,pVVar14);
      tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
      p_Var2 = &local_88._M_impl.super__Rb_tree_header;
      local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           local_58.super_variant<arm::RegisterOperand,_int>.
           super__Variant_base<arm::RegisterOperand,_int>.
           super__Move_assign_alias<arm::RegisterOperand,_int>.
           super__Copy_assign_alias<arm::RegisterOperand,_int>.
           super__Move_ctor_alias<arm::RegisterOperand,_int>.
           super__Copy_ctor_alias<arm::RegisterOperand,_int>.
           super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
      local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
        ::_S_vtable._M_arr
        [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                     super__Variant_base<arm::RegisterOperand,_int>.
                     super__Move_assign_alias<arm::RegisterOperand,_int>.
                     super__Copy_assign_alias<arm::RegisterOperand,_int>.
                     super__Move_ctor_alias<arm::RegisterOperand,_int>.
                     super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                     super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
                (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
      local_88._M_impl._0_8_ = &PTR_display_001ed820;
      *(OpCode *)
       ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Rsb;
      *(ConditionCode *)
       ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
      *(undefined ***)
       tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
      *(Reg *)&(((Inst *)((long)tVar9.
                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
               super_Displayable)._vptr_Displayable = RVar7;
      *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
      local_90.__lhs =
           (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
           ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
      *(__index_type *)
       &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
        super_Displayable)._vptr_Displayable =
           (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr
        [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
        _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
                 (variant<arm::RegisterOperand,_int> *)p_Var2);
      *(undefined ***)
       ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820
      ;
      local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98)
      ;
      _Var11._M_head_impl =
           (Inst *)local_98._M_t.
                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    }
    break;
  case Mul:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    OVar6 = translate_value_to_reg(this,pVVar14);
    local_58.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    ((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->op = OVar6;
    *(undefined2 *)&((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->cond = 1;
    ((Inst *)local_58.super_Displayable._vptr_Displayable)->op = Mul;
    ((Inst *)local_58.super_Displayable._vptr_Displayable)->cond = Always;
    (((Inst *)local_58.super_Displayable._vptr_Displayable)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)&(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->
                    super_Displayable)._vptr_Displayable + 4) = RVar8;
    *(undefined1 *)
     &(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x30))->super_Displayable).
      _vptr_Displayable = 0;
    (((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->super_Displayable).
    _vptr_Displayable = (_func_int **)&PTR_display_001ed7c0;
    *(undefined ***)&((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->op =
         &PTR_display_001ed820;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_58);
    _Var11._M_head_impl = (Inst *)local_58.super_Displayable._vptr_Displayable;
    break;
  case Div:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    OVar6 = translate_value_to_reg(this,pVVar14);
    local_58.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    ((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->op = OVar6;
    *(undefined2 *)&((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->cond = 1;
    ((Inst *)local_58.super_Displayable._vptr_Displayable)->op = SDiv;
    ((Inst *)local_58.super_Displayable._vptr_Displayable)->cond = Always;
    (((Inst *)local_58.super_Displayable._vptr_Displayable)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)&(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->
                    super_Displayable)._vptr_Displayable + 4) = RVar8;
    *(undefined1 *)
     &(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x30))->super_Displayable).
      _vptr_Displayable = 0;
    (((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->super_Displayable).
    _vptr_Displayable = (_func_int **)&PTR_display_001ed7c0;
    *(undefined ***)&((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->op =
         &PTR_display_001ed820;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_58);
    _Var11._M_head_impl = (Inst *)local_58.super_Displayable._vptr_Displayable;
    break;
  case MulSh:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    OVar6 = translate_value_to_reg(this,pVVar14);
    local_58.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    ((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->op = OVar6;
    *(undefined2 *)&((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->cond = 1;
    ((Inst *)local_58.super_Displayable._vptr_Displayable)->op = SMMul;
    ((Inst *)local_58.super_Displayable._vptr_Displayable)->cond = Always;
    (((Inst *)local_58.super_Displayable._vptr_Displayable)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)&(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->
                    super_Displayable)._vptr_Displayable + 4) = RVar8;
    *(undefined1 *)
     &(((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x30))->super_Displayable).
      _vptr_Displayable = 0;
    (((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x20))->super_Displayable).
    _vptr_Displayable = (_func_int **)&PTR_display_001ed7c0;
    *(undefined ***)&((Inst *)((long)local_58.super_Displayable._vptr_Displayable + 0x10))->op =
         &PTR_display_001ed820;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_58);
    _Var11._M_head_impl = (Inst *)local_58.super_Displayable._vptr_Displayable;
    break;
  case Rem:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = _Mod;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Gt:
    cond = Gt;
    goto LAB_00165092;
  case Lt:
    cond = Lt;
    goto LAB_00165092;
  case Gte:
    cond = Ge;
    goto LAB_00165092;
  case Lte:
    cond = Le;
    goto LAB_00165092;
  case Eq:
    cond = Equal;
    goto LAB_00165092;
  case Neq:
    cond = NotEqual;
LAB_00165092:
    emit_compare(this,&(i->super_Inst).dest,v,pVVar14,cond,reversed);
    return;
  case And:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = And;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Or:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Orr;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Xor:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Eor;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Not:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    translate_value_to_operand2(&local_58,this,v);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Mvn;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed930;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Shl:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Lsl;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Shr:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Lsr;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case ShrA:
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_88._M_impl._0_8_ = &PTR_display_001eb100;
    RVar7 = get_or_alloc_vgp(this,(VarId *)&local_88);
    RVar8 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_58,this,pVVar14);
    tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         local_58.super_variant<arm::RegisterOperand,_int>.
         super__Variant_base<arm::RegisterOperand,_int>.
         super__Move_assign_alias<arm::RegisterOperand,_int>.
         super__Copy_assign_alias<arm::RegisterOperand,_int>.
         super__Move_ctor_alias<arm::RegisterOperand,_int>.
         super__Copy_ctor_alias<arm::RegisterOperand,_int>.
         super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index;
    local_90.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var2;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_int>_&&>
      ::_S_vtable._M_arr
      [(long)(char)local_58.super_variant<arm::RegisterOperand,_int>.
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index + 1]._M_data)
              (&local_90,&local_58.super_variant<arm::RegisterOperand,_int>);
    local_88._M_impl._0_8_ = &PTR_display_001ed820;
    *(OpCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Asr;
    *(ConditionCode *)
     ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001ed8f0;
    *(Reg *)&(((Inst *)((long)tVar9.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar7;
    *(Reg *)((long)&(((Inst *)((long)tVar9.
                                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                     .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10)
                     )->super_Displayable)._vptr_Displayable + 4) = RVar8;
    local_90.__lhs =
         (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(__index_type *)
     &(((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable =
         (__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr
      [(long)(char)(__index_type)local_88._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)((anon_class_8_1_a78179b7_conflict8 *)&local_90,
               (variant<arm::RegisterOperand,_int> *)p_Var2);
    *(undefined ***)
     &((Inst *)((long)tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->op =
         &PTR_display_001ed820;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar9.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  default:
    goto switchD_001644db_default;
  }
  if ((_Head_base<0UL,_arm::Inst_*,_false>)_Var11._M_head_impl !=
      (_Head_base<0UL,_arm::Inst_*,_false>)0x0) {
    (*((_Var11._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
switchD_001644db_default:
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpInst& i) {
  // Reverse when:
  //  - lhs is immediate
  //  - lhs is variable with shift and rhs is regular variable
  bool reverse_params = ((i.lhs.is_immediate() && !i.rhs.is_immediate()) ||
                         (!i.lhs.is_immediate() && !i.rhs.is_immediate() &&
                          i.lhs.has_shift() && !i.rhs.has_shift())) &&
                        can_reverse_param(i.op);

  mir::inst::Value& lhs = reverse_params ? i.rhs : i.lhs;
  mir::inst::Value& rhs = reverse_params ? i.lhs : i.rhs;

  switch (i.op) {
    case mir::inst::Op::Add:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Add, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Sub:
      if (reverse_params) {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Rsb, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      } else {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Sub, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      }
      break;

    case mir::inst::Op::Mul:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Mul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::MulSh:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SMMul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::Div:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SDiv, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::And:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::And, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Or:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Orr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Xor:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Eor, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Not:
      inst.push_back(std::make_unique<Arith2Inst>(
          arm::OpCode::Mvn, translate_var_reg(i.dest),
          translate_value_to_operand2(lhs)));
      break;

    case mir::inst::Op::Shl:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsl, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Shr:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::ShrA:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Asr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Rem:
      // WARN: Mod is a pseudo-instruction!
      // Mod operations needs to be eliminated in later passes.
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::_Mod, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;
    case mir::inst::Op::Gt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Gt, reverse_params);
      break;
    case mir::inst::Op::Lt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Lt, reverse_params);
      break;
    case mir::inst::Op::Gte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Ge, reverse_params);
      break;
    case mir::inst::Op::Lte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Le, reverse_params);
      break;
    case mir::inst::Op::Eq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Equal, reverse_params);
      break;
    case mir::inst::Op::Neq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::NotEqual, reverse_params);
      break;
  }
}